

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_rinfo(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  ROOM_INDEX_DATA *pRVar2;
  size_t sVar3;
  char *__src;
  flag_type *pfVar4;
  char *txt;
  double dVar5;
  char buf [4608];
  char arg [4608];
  
  txt = buf;
  one_argument(argument,arg);
  if (arg[0] == '\0') {
    pRVar2 = ch->in_room;
  }
  else {
    pRVar2 = find_location(ch,arg);
  }
  if (pRVar2 == (ROOM_INDEX_DATA *)0x0) {
    txt = "No such location.\n\r";
  }
  else {
    sprintf(buf,"Room %d flags (%s):\n\r",(ulong)(uint)(int)pRVar2->vnum,pRVar2->name);
    uVar1 = pRVar2->area->area_flags[0];
    if ((uVar1 & 1) != 0) {
      sVar3 = strlen(buf);
      builtin_strncpy(buf + sVar3,"AREA_EXPLORE\n\r",0xf);
    }
    if ((uVar1 & 2) != 0) {
      sVar3 = strlen(buf);
      builtin_strncpy(buf + sVar3,"AREA_NO_NEWBIES\n\r",0x12);
    }
    if ((uVar1 & 4) != 0) {
      sVar3 = strlen(buf);
      builtin_strncpy(buf + sVar3,"AREA_UNGHOST\n\r",0xf);
    }
    for (pfVar4 = room_flags; pfVar4->name != (char *)0x0; pfVar4 = pfVar4 + 1) {
      uVar1 = pRVar2->room_flags[(int)(pfVar4->bit / 0x20)];
      dVar5 = exp2((double)(pfVar4->bit % 0x20));
      if ((uVar1 & (long)dVar5) != 0) {
        sVar3 = strlen(buf);
        builtin_strncpy(buf + sVar3,"ROOM ",6);
        __src = upstring(pfVar4->name);
        strcat(buf,__src);
        sVar3 = strlen(buf);
        (buf + sVar3)[0] = '\n';
        (buf + sVar3)[1] = '\r';
        buf[sVar3 + 2] = '\0';
      }
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_rinfo(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	char buf[MAX_STRING_LENGTH];
	ROOM_INDEX_DATA *location;

	one_argument(argument, arg);

	location = (arg[0] == '\0')
		? ch->in_room
		: find_location(ch, arg);

	if (location == nullptr)
	{
		send_to_char("No such location.\n\r", ch);
		return;
	}

	sprintf(buf, "Room %d flags (%s):\n\r", location->vnum, location->name);

	if (IS_SET(location->area->area_flags, AREA_EXPLORE))
		strcat(buf, "AREA_EXPLORE\n\r");

	if (IS_SET(location->area->area_flags, AREA_NO_NEWBIES))
		strcat(buf, "AREA_NO_NEWBIES\n\r");

	if (IS_SET(location->area->area_flags, AREA_UNGHOST))
		strcat(buf, "AREA_UNGHOST\n\r");

	for (int i = 0; room_flags[i].name != nullptr; i++)
	{
		if (IS_SET(location->room_flags, room_flags[i].bit))
		{
			strcat(buf, "ROOM ");
			strcat(buf, upstring(room_flags[i].name));
			strcat(buf, "\n\r");
		}
	}

	if (location->room_flags == 0 && location->area->area_flags == 0)
		strcat(buf, "(no flags)\n\r");

	send_to_char(buf, ch);
}